

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
          (QMovableArrayOps<QString> *this,qsizetype i,QString *args)

{
  QString **ppQVar1;
  QString *pQVar2;
  Data *pDVar3;
  long lVar4;
  Data *pDVar5;
  char16_t *pcVar6;
  qsizetype qVar7;
  QString *pQVar8;
  qsizetype *pqVar9;
  bool bVar10;
  
  pDVar3 = (this->super_QGenericArrayOps<QString>).super_QArrayDataPointer<QString>.d;
  if ((pDVar3 != (Data *)0x0) &&
     ((__int_type)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int> < 2)) {
    lVar4 = (this->super_QGenericArrayOps<QString>).super_QArrayDataPointer<QString>.size;
    if ((lVar4 == i && pDVar3 != (Data *)0x0) &&
       ((pDVar3->super_QArrayData).alloc - lVar4 !=
        ((long)((long)(this->super_QGenericArrayOps<QString>).super_QArrayDataPointer<QString>.ptr -
               ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 3) *
        -0x5555555555555555)) {
      pQVar8 = (this->super_QGenericArrayOps<QString>).super_QArrayDataPointer<QString>.ptr;
      pDVar5 = (args->d).d;
      pQVar8[lVar4].d.d = pDVar5;
      pQVar8[lVar4].d.ptr = (args->d).ptr;
      pQVar8[lVar4].d.size = (args->d).size;
      if (pDVar5 != (Data *)0x0) {
        LOCK();
        (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      goto LAB_00109a33;
    }
    if (((i == 0) && (pDVar3 != (Data *)0x0)) &&
       ((QString *)((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) !=
        (this->super_QGenericArrayOps<QString>).super_QArrayDataPointer<QString>.ptr)) {
      pQVar8 = (this->super_QGenericArrayOps<QString>).super_QArrayDataPointer<QString>.ptr;
      pDVar5 = (args->d).d;
      pQVar8[-1].d.d = pDVar5;
      pQVar8[-1].d.ptr = (args->d).ptr;
      pQVar8[-1].d.size = (args->d).size;
      if (pDVar5 != (Data *)0x0) {
        LOCK();
        (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      ppQVar1 = &(this->super_QGenericArrayOps<QString>).super_QArrayDataPointer<QString>.ptr;
      *ppQVar1 = *ppQVar1 + -1;
      goto LAB_00109a33;
    }
  }
  pDVar5 = (args->d).d;
  pcVar6 = (args->d).ptr;
  qVar7 = (args->d).size;
  if (pDVar5 != (Data *)0x0) {
    LOCK();
    (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  bVar10 = (this->super_QGenericArrayOps<QString>).super_QArrayDataPointer<QString>.size != 0;
  QArrayDataPointer<QString>::detachAndGrow
            ((QArrayDataPointer<QString> *)this,(uint)(i == 0 && bVar10),1,(QString **)0x0,
             (QArrayDataPointer<QString> *)0x0);
  pQVar8 = (this->super_QGenericArrayOps<QString>).super_QArrayDataPointer<QString>.ptr;
  if (i == 0 && bVar10) {
    pQVar8[-1].d.d = pDVar5;
    pQVar8[-1].d.ptr = pcVar6;
    pQVar8[-1].d.size = qVar7;
    (this->super_QGenericArrayOps<QString>).super_QArrayDataPointer<QString>.ptr = pQVar8 + -1;
  }
  else {
    pQVar2 = pQVar8 + i;
    memmove(pQVar2 + 1,pQVar8 + i,
            ((this->super_QGenericArrayOps<QString>).super_QArrayDataPointer<QString>.size - i) *
            0x18);
    (pQVar2->d).d = pDVar5;
    (pQVar2->d).ptr = pcVar6;
    (pQVar2->d).size = qVar7;
  }
LAB_00109a33:
  pqVar9 = &(this->super_QGenericArrayOps<QString>).super_QArrayDataPointer<QString>.size;
  *pqVar9 = *pqVar9 + 1;
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }